

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

pairNf * __thiscall
pbrt::syntactic::ParamSet::getParamPairNf
          (pairNf *__return_storage_ptr__,ParamSet *this,string *name,pairNf *fallBack)

{
  uint uVar1;
  int iVar2;
  const_iterator cVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *prVar4;
  ulong uVar5;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  shared_ptr<pbrt::syntactic::Param> pr;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->param)._M_t._M_impl.super__Rb_tree_header) {
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
              (__return_storage_ptr__,fallBack);
  }
  else {
    std::__shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pr.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2> *)
               (cVar3._M_node + 2));
    std::dynamic_pointer_cast<pbrt::syntactic::ParamArray<float>,pbrt::syntactic::Param>
              ((shared_ptr<pbrt::syntactic::Param> *)&p);
    if (p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_58,"3f: found param of given name, but of wrong type! (name was \'",name
                    );
      std::operator+(&local_78,&local_58,"\'");
      std::runtime_error::runtime_error(prVar4,(string *)&local_78);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = (*((p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Param)._vptr_Param[1])();
    if ((uVar1 & 1) != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_58,
                     "found param of given name and type, but components aren\'t pairs! (PairNf, name=\'"
                     ,name);
      std::operator+(&local_78,&local_58,"\'");
      std::runtime_error::runtime_error(prVar4,(string *)&local_78);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = (*((p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Param)._vptr_Param[1])();
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
              (__return_storage_ptr__,CONCAT44(extraout_var,iVar2) >> 1,(allocator_type *)&local_78)
    ;
    uVar5 = 0;
    while( true ) {
      iVar2 = (*((p.
                  super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Param)._vptr_Param[1])();
      if (CONCAT44(extraout_var_00,iVar2) <= uVar5) break;
      *(undefined8 *)
       (&((__return_storage_ptr__->
          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
          _M_impl.super__Vector_impl_data._M_start)->first + uVar5) =
           *(undefined8 *)
            (((p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start + uVar5);
      uVar5 = uVar5 + 2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pr.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

pairNf ParamSet::getParamPairNf(const std::string &name, const pairNf &fallBack) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return fallBack;
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<float>> p = std::dynamic_pointer_cast<ParamArray<float>>(pr);
      if (!p)
        throw std::runtime_error("3f: found param of given name, but of wrong type! (name was '"+name+"'");
      if (p->getSize() % 2 != 0)
        throw std::runtime_error("found param of given name and type, but components aren't pairs! (PairNf, name='"+name+"'");
      std::size_t N = p->getSize()/2;
      pairNf res(N);
      for (std::size_t i=0; i<p->getSize(); i+=2)
      {
        res[i/2] = std::make_pair(p->get(i), p->get(i+1));
      }
      return res;
    }